

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  type pbVar1;
  Message *in_RDI;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(in_stack_ffffffffffffffa0);
  pbVar1 = pbVar1 + 0x10;
  GetString_abi_cxx11_(in_RDI);
  std::operator<<((ostream *)pbVar1,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }